

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void cpu_x86_cpuid_x86_64
               (CPUX86State *env,uint32_t index,uint32_t count,uint32_t *eax,uint32_t *ebx,
               uint32_t *ecx,uint32_t *edx)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint32_t uVar5;
  ArchCPU *cpu_00;
  CPUState *pCVar6;
  uint64_t uVar7;
  CPUCacheInfo *local_a0;
  ExtSaveArea *esa;
  uint local_60;
  X86CPUTopoInfo topo_info;
  uint32_t signature [3];
  uint32_t limit;
  uint32_t die_offset;
  CPUState *cs;
  X86CPU *cpu;
  uint32_t *ecx_local;
  uint32_t *ebx_local;
  uint32_t *eax_local;
  uint32_t count_local;
  uint32_t index_local;
  CPUX86State *env_local;
  
  cpu_00 = env_archcpu(env);
  pCVar6 = env_cpu(env);
  esa._4_4_ = env->nr_nodes;
  local_60 = env->nr_dies;
  topo_info.nodes_per_pkg = pCVar6->nr_cores;
  topo_info.dies_per_pkg = pCVar6->nr_threads;
  if (index < 0xc0000000) {
    if (index < 0x80000000) {
      if (index < 0x40000000) {
        signature[1] = env->cpuid_level;
      }
      else {
        signature[1] = 0x40000001;
      }
    }
    else {
      signature[1] = env->cpuid_xlevel;
    }
  }
  else {
    signature[1] = env->cpuid_xlevel2;
  }
  eax_local._4_4_ = index;
  if (signature[1] < index) {
    eax_local._4_4_ = env->cpuid_level;
  }
  if (eax_local._4_4_ == 0x80000001) {
    *eax = env->cpuid_version;
    *ebx = 0;
    *ecx = (uint32_t)env->features[7];
    *edx = (uint32_t)env->features[6];
    if ((1 < pCVar6->nr_cores * pCVar6->nr_threads) &&
       (((env->cpuid_vendor1 != 0x756e6547 || (env->cpuid_vendor2 != 0x49656e69)) ||
        (env->cpuid_vendor3 != 0x6c65746e)))) {
      *ecx = *ecx | 2;
    }
  }
  else if (eax_local._4_4_ + 0x7ffffffe < 3) {
    *eax = env->cpuid_model[(eax_local._4_4_ + 0x7ffffffe) * 4];
    *ebx = env->cpuid_model[(eax_local._4_4_ + 0x7ffffffe) * 4 + 1];
    *ecx = env->cpuid_model[(eax_local._4_4_ + 0x7ffffffe) * 4 + 2];
    *edx = env->cpuid_model[(eax_local._4_4_ + 0x7ffffffe) * 4 + 3];
  }
  else if (eax_local._4_4_ == 0x80000005) {
    if ((cpu_00->cache_info_passthrough & 1U) == 0) {
      *eax = 0x1ff01ff;
      *ebx = 0x1ff01ff;
      uVar5 = encode_cache_cpuid80000005((env->cache_info_amd).l1d_cache);
      *ecx = uVar5;
      uVar5 = encode_cache_cpuid80000005((env->cache_info_amd).l1i_cache);
      *edx = uVar5;
    }
    else {
      host_cpuid_x86_64(0x80000005,0,eax,ebx,ecx,edx);
    }
  }
  else if (eax_local._4_4_ == 0x80000006) {
    if ((cpu_00->cache_info_passthrough & 1U) == 0) {
      *eax = 0;
      *ebx = 0x42004200;
      if ((cpu_00->enable_l3_cache & 1U) == 0) {
        local_a0 = (CPUCacheInfo *)0x0;
      }
      else {
        local_a0 = (env->cache_info_amd).l3_cache;
      }
      encode_cache_cpuid80000006((env->cache_info_amd).l2_cache,local_a0,ecx,edx);
    }
    else {
      host_cpuid_x86_64(0x80000006,0,eax,ebx,ecx,edx);
    }
  }
  else if (eax_local._4_4_ == 0x80000007) {
    *eax = 0;
    *ebx = 0;
    *ecx = 0;
    *edx = (uint32_t)env->features[8];
  }
  else if (eax_local._4_4_ == 0x80000008) {
    if ((env->features[6] & 0x20000000) == 0) {
      *eax = cpu_00->phys_bits;
    }
    else {
      *eax = cpu_00->phys_bits;
      if ((env->features[3] & 0x10000) == 0) {
        *eax = *eax | 0x3000;
      }
      else {
        *eax = *eax | 0x3900;
      }
    }
    *ebx = (uint32_t)env->features[9];
    *ecx = 0;
    *edx = 0;
    if (1 < pCVar6->nr_cores * pCVar6->nr_threads) {
      *ecx = pCVar6->nr_cores * pCVar6->nr_threads - 1U | *ecx;
    }
  }
  else if (eax_local._4_4_ == 0x8000000a) {
    if ((env->features[7] & 4) == 0) {
      *eax = 0;
      *ebx = 0;
      *ecx = 0;
      *edx = 0;
    }
    else {
      *eax = 1;
      *ebx = 0x10;
      *ecx = 0;
      *edx = (uint32_t)env->features[0x12];
    }
  }
  else if (eax_local._4_4_ == 0x8000001d) {
    *eax = 0;
    if ((cpu_00->cache_info_passthrough & 1U) == 0) {
      switch(count) {
      case 0:
        encode_cache_cpuid8000001d
                  ((env->cache_info_amd).l1d_cache,(X86CPUTopoInfo *)((long)&esa + 4),eax,ebx,ecx,
                   edx);
        break;
      case 1:
        encode_cache_cpuid8000001d
                  ((env->cache_info_amd).l1i_cache,(X86CPUTopoInfo *)((long)&esa + 4),eax,ebx,ecx,
                   edx);
        break;
      case 2:
        encode_cache_cpuid8000001d
                  ((env->cache_info_amd).l2_cache,(X86CPUTopoInfo *)((long)&esa + 4),eax,ebx,ecx,edx
                  );
        break;
      case 3:
        encode_cache_cpuid8000001d
                  ((env->cache_info_amd).l3_cache,(X86CPUTopoInfo *)((long)&esa + 4),eax,ebx,ecx,edx
                  );
        break;
      default:
        *edx = 0;
        *ecx = 0;
        *ebx = 0;
        *eax = 0;
      }
    }
    else {
      host_cpuid_x86_64(0x8000001d,count,eax,ebx,ecx,edx);
    }
  }
  else if (eax_local._4_4_ == 0x8000001e) {
    if (0xff < cpu_00->core_id) {
      __assert_fail("cpu->core_id <= 255",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                    ,0x114b,
                    "void cpu_x86_cpuid_x86_64(CPUX86State *, uint32_t, uint32_t, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                   );
    }
    encode_topo_cpuid8000001e((X86CPUTopoInfo *)((long)&esa + 4),cpu_00,eax,ebx,ecx,edx);
  }
  else if (eax_local._4_4_ == 0xc0000000) {
    *eax = env->cpuid_xlevel2;
    *ebx = 0;
    *ecx = 0;
    *edx = 0;
  }
  else if (eax_local._4_4_ == 0xc0000001) {
    *eax = env->cpuid_version;
    *ebx = 0;
    *ecx = 0;
    *edx = (uint32_t)env->features[10];
  }
  else if (eax_local._4_4_ + 0x3ffffffe < 3) {
    *eax = 0;
    *ebx = 0;
    *ecx = 0;
    *edx = 0;
  }
  else if (eax_local._4_4_ == 0) {
    *eax = env->cpuid_level;
    *ebx = env->cpuid_vendor1;
    *edx = env->cpuid_vendor2;
    *ecx = env->cpuid_vendor3;
  }
  else if (eax_local._4_4_ == 1) {
    *eax = env->cpuid_version;
    *ebx = cpu_00->apic_id << 0x18 | 0x800;
    *ecx = (uint32_t)env->features[1];
    if (((*ecx & 0x4000000) != 0) && ((env->cr[4] & 0x40000) != 0)) {
      *ecx = *ecx | 0x8000000;
    }
    *edx = (uint32_t)env->features[0];
    if (1 < pCVar6->nr_cores * pCVar6->nr_threads) {
      *ebx = pCVar6->nr_cores * pCVar6->nr_threads * 0x10000 | *ebx;
      *edx = *edx | 0x10000000;
    }
  }
  else if (eax_local._4_4_ == 2) {
    if ((cpu_00->cache_info_passthrough & 1U) == 0) {
      *eax = 1;
      *ebx = 0;
      if ((cpu_00->enable_l3_cache & 1U) == 0) {
        *ecx = 0;
      }
      else {
        bVar1 = cpuid2_cache_descriptor((env->cache_info_cpuid2).l3_cache);
        *ecx = (uint)bVar1;
      }
      bVar1 = cpuid2_cache_descriptor((env->cache_info_cpuid2).l1d_cache);
      bVar2 = cpuid2_cache_descriptor((env->cache_info_cpuid2).l1i_cache);
      bVar3 = cpuid2_cache_descriptor((env->cache_info_cpuid2).l2_cache);
      *edx = (uint)bVar1 << 0x10 | (uint)bVar2 << 8 | (uint)bVar3;
    }
    else {
      host_cpuid_x86_64(2,0,eax,ebx,ecx,edx);
    }
  }
  else if (eax_local._4_4_ == 4) {
    if ((cpu_00->cache_info_passthrough & 1U) == 0) {
      *eax = 0;
      switch(count) {
      case 0:
        encode_cache_cpuid4((env->cache_info_cpuid4).l1d_cache,1,pCVar6->nr_cores,eax,ebx,ecx,edx);
        break;
      case 1:
        encode_cache_cpuid4((env->cache_info_cpuid4).l1i_cache,1,pCVar6->nr_cores,eax,ebx,ecx,edx);
        break;
      case 2:
        encode_cache_cpuid4((env->cache_info_cpuid4).l2_cache,pCVar6->nr_threads,pCVar6->nr_cores,
                            eax,ebx,ecx,edx);
        break;
      case 3:
        uVar4 = apicid_die_offset((X86CPUTopoInfo *)((long)&esa + 4));
        if ((cpu_00->enable_l3_cache & 1U) != 0) {
          encode_cache_cpuid4((env->cache_info_cpuid4).l3_cache,1 << ((byte)uVar4 & 0x1f),
                              pCVar6->nr_cores,eax,ebx,ecx,edx);
          return;
        }
      default:
        *edx = 0;
        *ecx = 0;
        *ebx = 0;
        *eax = 0;
      }
    }
    else {
      host_cpuid_x86_64(4,count,eax,ebx,ecx,edx);
      *eax = *eax & 0x3ffffff;
      if (((*eax & 0x1f) != 0) && (1 < pCVar6->nr_cores)) {
        *eax = (pCVar6->nr_cores + -1) * 0x4000000 | *eax;
      }
    }
  }
  else if (eax_local._4_4_ == 5) {
    *eax = (cpu_00->mwait).eax;
    *ebx = (cpu_00->mwait).ebx;
    *ecx = (cpu_00->mwait).ecx;
    *edx = (cpu_00->mwait).edx;
  }
  else if (eax_local._4_4_ == 6) {
    *eax = (uint32_t)env->features[0x14];
    *ebx = 0;
    *ecx = 0;
    *edx = 0;
  }
  else if (eax_local._4_4_ == 7) {
    if (count == 0) {
      *eax = env->cpuid_level_func7;
      *ebx = (uint32_t)env->features[2];
      *ecx = (uint32_t)env->features[3];
      if (((*ecx & 8) != 0) && ((env->cr[4] & 0x400000) != 0)) {
        *ecx = *ecx | 0x10;
      }
      *edx = (uint32_t)env->features[4];
    }
    else if (count == 1) {
      *eax = (uint32_t)env->features[5];
      *ebx = 0;
      *ecx = 0;
      *edx = 0;
    }
    else {
      *eax = 0;
      *ebx = 0;
      *ecx = 0;
      *edx = 0;
    }
  }
  else if (eax_local._4_4_ == 9) {
    *eax = 0;
    *ebx = 0;
    *ecx = 0;
    *edx = 0;
  }
  else if (eax_local._4_4_ == 10) {
    *eax = 0;
    *ebx = 0;
    *ecx = 0;
    *edx = 0;
  }
  else {
    eax_local._0_1_ = (byte)count;
    if (eax_local._4_4_ == 0xb) {
      if ((cpu_00->enable_cpuid_0xb & 1U) == 0) {
        *edx = 0;
        *ecx = 0;
        *ebx = 0;
        *eax = 0;
      }
      else {
        *ecx = count & 0xff;
        *edx = cpu_00->apic_id;
        if (count == 0) {
          uVar4 = apicid_core_offset((X86CPUTopoInfo *)((long)&esa + 4));
          *eax = uVar4;
          *ebx = pCVar6->nr_threads;
          *ecx = *ecx | 0x100;
        }
        else if (count == 1) {
          *eax = env->pkg_offset;
          *ebx = pCVar6->nr_cores * pCVar6->nr_threads;
          *ecx = *ecx | 0x200;
        }
        else {
          *eax = 0;
          *ebx = 0;
          *ecx = *ecx;
        }
        if ((*eax & 0xffffffe0) != 0) {
          __assert_fail("!(*eax & ~0x1f)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                        ,0x1057,
                        "void cpu_x86_cpuid_x86_64(CPUX86State *, uint32_t, uint32_t, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                       );
        }
        *ebx = *ebx & 0xffff;
      }
    }
    else if (eax_local._4_4_ == 0xd) {
      *eax = 0;
      *ebx = 0;
      *ecx = 0;
      *edx = 0;
      if ((env->features[1] & 0x4000000) != 0) {
        if (count == 0) {
          uVar7 = x86_cpu_xsave_components(cpu_00);
          uVar5 = xsave_area_size(uVar7);
          *ecx = uVar5;
          *eax = (uint32_t)env->features[0x15];
          *edx = (uint32_t)env->features[0x16];
          uVar5 = xsave_area_size(env->xcr0);
          *ebx = uVar5;
        }
        else if (count == 1) {
          *eax = (uint32_t)env->features[0x13];
        }
        else if ((count < 10) &&
                (uVar7 = x86_cpu_xsave_components(cpu_00),
                (uVar7 >> ((byte)eax_local & 0x3f) & 1) != 0)) {
          *eax = x86_ext_save_areas[count].size;
          *ebx = x86_ext_save_areas[count].offset;
        }
      }
    }
    else if (eax_local._4_4_ == 0x14) {
      *eax = 0;
      *ebx = 0;
      *ecx = 0;
      *edx = 0;
      if ((env->features[2] & 0x2000000) != 0) {
        if (count == 0) {
          *eax = 1;
          *ebx = 0xf;
          *ecx = 7;
        }
        else if (count == 1) {
          *eax = 0x2490002;
          *ebx = 0x3f1fff;
        }
      }
    }
    else if (eax_local._4_4_ == 0x1f) {
      if (env->nr_dies < 2) {
        *edx = 0;
        *ecx = 0;
        *ebx = 0;
        *eax = 0;
      }
      else {
        *ecx = count & 0xff;
        *edx = cpu_00->apic_id;
        if (count == 0) {
          uVar4 = apicid_core_offset((X86CPUTopoInfo *)((long)&esa + 4));
          *eax = uVar4;
          *ebx = pCVar6->nr_threads;
          *ecx = *ecx | 0x100;
        }
        else if (count == 1) {
          uVar4 = apicid_die_offset((X86CPUTopoInfo *)((long)&esa + 4));
          *eax = uVar4;
          *ebx = pCVar6->nr_cores * pCVar6->nr_threads;
          *ecx = *ecx | 0x200;
        }
        else if (count == 2) {
          *eax = env->pkg_offset;
          *ebx = env->nr_dies * pCVar6->nr_cores * pCVar6->nr_threads;
          *ecx = *ecx | 0x500;
        }
        else {
          *eax = 0;
          *ebx = 0;
          *ecx = *ecx;
        }
        if ((*eax & 0xffffffe0) != 0) {
          __assert_fail("!(*eax & ~0x1f)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                        ,0x1078,
                        "void cpu_x86_cpuid_x86_64(CPUX86State *, uint32_t, uint32_t, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                       );
        }
        *ebx = *ebx & 0xffff;
      }
    }
    else if (eax_local._4_4_ == 0x40000000) {
      if ((cpu_00->expose_tcg & 1U) == 0) {
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
      }
      else {
        *eax = 0x40000001;
        *ebx = 0x54474354;
        *ecx = 0x43544743;
        *edx = 0x47435447;
      }
    }
    else if (eax_local._4_4_ == 0x40000001) {
      *eax = 0;
      *ebx = 0;
      *ecx = 0;
      *edx = 0;
    }
    else {
      *eax = 0;
      *ebx = 0;
      *ecx = 0;
      *edx = 0;
    }
  }
  return;
}

Assistant:

void cpu_x86_cpuid(CPUX86State *env, uint32_t index, uint32_t count,
                   uint32_t *eax, uint32_t *ebx,
                   uint32_t *ecx, uint32_t *edx)
{
    X86CPU *cpu = env_archcpu(env);
    CPUState *cs = env_cpu(env);
    uint32_t die_offset;
    uint32_t limit;
    uint32_t signature[3];
    X86CPUTopoInfo topo_info;

    topo_info.nodes_per_pkg = env->nr_nodes;
    topo_info.dies_per_pkg = env->nr_dies;
    topo_info.cores_per_die = cs->nr_cores;
    topo_info.threads_per_core = cs->nr_threads;

    /* Calculate & apply limits for different index ranges */
    if (index >= 0xC0000000) {
        limit = env->cpuid_xlevel2;
    } else if (index >= 0x80000000) {
        limit = env->cpuid_xlevel;
    } else if (index >= 0x40000000) {
        limit = 0x40000001;
    } else {
        limit = env->cpuid_level;
    }

    if (index > limit) {
        /* Intel documentation states that invalid EAX input will
         * return the same information as EAX=cpuid_level
         * (Intel SDM Vol. 2A - Instruction Set Reference - CPUID)
         */
        index = env->cpuid_level;
    }

    switch(index) {
    case 0:
        *eax = env->cpuid_level;
        *ebx = env->cpuid_vendor1;
        *edx = env->cpuid_vendor2;
        *ecx = env->cpuid_vendor3;
        break;
    case 1:
        *eax = env->cpuid_version;
        *ebx = (cpu->apic_id << 24) |
               8 << 8; /* CLFLUSH size in quad words, Linux wants it. */
        *ecx = env->features[FEAT_1_ECX];
        if ((*ecx & CPUID_EXT_XSAVE) && (env->cr[4] & CR4_OSXSAVE_MASK)) {
            *ecx |= CPUID_EXT_OSXSAVE;
        }
        *edx = env->features[FEAT_1_EDX];
        if (cs->nr_cores * cs->nr_threads > 1) {
            *ebx |= (cs->nr_cores * cs->nr_threads) << 16;
            *edx |= CPUID_HT;
        }
        break;
    case 2:
        /* cache info: needed for Pentium Pro compatibility */
        if (cpu->cache_info_passthrough) {
            host_cpuid(index, 0, eax, ebx, ecx, edx);
            break;
        }
        *eax = 1; /* Number of CPUID[EAX=2] calls required */
        *ebx = 0;
        if (!cpu->enable_l3_cache) {
            *ecx = 0;
        } else {
            *ecx = cpuid2_cache_descriptor(env->cache_info_cpuid2.l3_cache);
        }
        *edx = (cpuid2_cache_descriptor(env->cache_info_cpuid2.l1d_cache) << 16) |
               (cpuid2_cache_descriptor(env->cache_info_cpuid2.l1i_cache) <<  8) |
               (cpuid2_cache_descriptor(env->cache_info_cpuid2.l2_cache));
        break;
    case 4:
        /* cache info: needed for Core compatibility */
        if (cpu->cache_info_passthrough) {
            host_cpuid(index, count, eax, ebx, ecx, edx);
            /* QEMU gives out its own APIC IDs, never pass down bits 31..26.  */
            *eax &= ~0xFC000000;
            if ((*eax & 31) && cs->nr_cores > 1) {
                *eax |= (cs->nr_cores - 1) << 26;
            }
        } else {
            *eax = 0;
            switch (count) {
            case 0: /* L1 dcache info */
                encode_cache_cpuid4(env->cache_info_cpuid4.l1d_cache,
                                    1, cs->nr_cores,
                                    eax, ebx, ecx, edx);
                break;
            case 1: /* L1 icache info */
                encode_cache_cpuid4(env->cache_info_cpuid4.l1i_cache,
                                    1, cs->nr_cores,
                                    eax, ebx, ecx, edx);
                break;
            case 2: /* L2 cache info */
                encode_cache_cpuid4(env->cache_info_cpuid4.l2_cache,
                                    cs->nr_threads, cs->nr_cores,
                                    eax, ebx, ecx, edx);
                break;
            case 3: /* L3 cache info */
                die_offset = apicid_die_offset(&topo_info);
                if (cpu->enable_l3_cache) {
                    encode_cache_cpuid4(env->cache_info_cpuid4.l3_cache,
                                        (1 << die_offset), cs->nr_cores,
                                        eax, ebx, ecx, edx);
                    break;
                }
                /* fall through */
            default: /* end of info */
                *eax = *ebx = *ecx = *edx = 0;
                break;
            }
        }
        break;
    case 5:
        /* MONITOR/MWAIT Leaf */
        *eax = cpu->mwait.eax; /* Smallest monitor-line size in bytes */
        *ebx = cpu->mwait.ebx; /* Largest monitor-line size in bytes */
        *ecx = cpu->mwait.ecx; /* flags */
        *edx = cpu->mwait.edx; /* mwait substates */
        break;
    case 6:
        /* Thermal and Power Leaf */
        *eax = env->features[FEAT_6_EAX];
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    case 7:
        /* Structured Extended Feature Flags Enumeration Leaf */
        if (count == 0) {
            /* Maximum ECX value for sub-leaves */
            *eax = env->cpuid_level_func7;
            *ebx = env->features[FEAT_7_0_EBX]; /* Feature flags */
            *ecx = env->features[FEAT_7_0_ECX]; /* Feature flags */
            if ((*ecx & CPUID_7_0_ECX_PKU) && env->cr[4] & CR4_PKE_MASK) {
                *ecx |= CPUID_7_0_ECX_OSPKE;
            }
            *edx = env->features[FEAT_7_0_EDX]; /* Feature flags */
        } else if (count == 1) {
            *eax = env->features[FEAT_7_1_EAX];
            *ebx = 0;
            *ecx = 0;
            *edx = 0;
        } else {
            *eax = 0;
            *ebx = 0;
            *ecx = 0;
            *edx = 0;
        }
        break;
    case 9:
        /* Direct Cache Access Information Leaf */
        *eax = 0; /* Bits 0-31 in DCA_CAP MSR */
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    case 0xA:
        /* Architectural Performance Monitoring Leaf */
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    case 0xB:
        /* Extended Topology Enumeration Leaf */
        if (!cpu->enable_cpuid_0xb) {
                *eax = *ebx = *ecx = *edx = 0;
                break;
        }

        *ecx = count & 0xff;
        *edx = cpu->apic_id;

        switch (count) {
        case 0:
            *eax = apicid_core_offset(&topo_info);
            *ebx = cs->nr_threads;
            *ecx |= CPUID_TOPOLOGY_LEVEL_SMT;
            break;
        case 1:
            *eax = env->pkg_offset;
            *ebx = cs->nr_cores * cs->nr_threads;
            *ecx |= CPUID_TOPOLOGY_LEVEL_CORE;
            break;
        default:
            *eax = 0;
            *ebx = 0;
            *ecx |= CPUID_TOPOLOGY_LEVEL_INVALID;
        }

        assert(!(*eax & ~0x1f));
        *ebx &= 0xffff; /* The count doesn't need to be reliable. */
        break;
    case 0x1F:
        /* V2 Extended Topology Enumeration Leaf */
        if (env->nr_dies < 2) {
            *eax = *ebx = *ecx = *edx = 0;
            break;
        }

        *ecx = count & 0xff;
        *edx = cpu->apic_id;
        switch (count) {
        case 0:
            *eax = apicid_core_offset(&topo_info);
            *ebx = cs->nr_threads;
            *ecx |= CPUID_TOPOLOGY_LEVEL_SMT;
            break;
        case 1:
            *eax = apicid_die_offset(&topo_info);
            *ebx = cs->nr_cores * cs->nr_threads;
            *ecx |= CPUID_TOPOLOGY_LEVEL_CORE;
            break;
        case 2:
            *eax = env->pkg_offset;
            *ebx = env->nr_dies * cs->nr_cores * cs->nr_threads;
            *ecx |= CPUID_TOPOLOGY_LEVEL_DIE;
            break;
        default:
            *eax = 0;
            *ebx = 0;
            *ecx |= CPUID_TOPOLOGY_LEVEL_INVALID;
        }
        assert(!(*eax & ~0x1f));
        *ebx &= 0xffff; /* The count doesn't need to be reliable. */
        break;
    case 0xD: {
        /* Processor Extended State */
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        if (!(env->features[FEAT_1_ECX] & CPUID_EXT_XSAVE)) {
            break;
        }

        if (count == 0) {
            *ecx = xsave_area_size(x86_cpu_xsave_components(cpu));
            *eax = env->features[FEAT_XSAVE_COMP_LO];
            *edx = env->features[FEAT_XSAVE_COMP_HI];
            /*
             * The initial value of xcr0 and ebx == 0, On host without kvm
             * commit 412a3c41(e.g., CentOS 6), the ebx's value always == 0
             * even through guest update xcr0, this will crash some legacy guest
             * (e.g., CentOS 6), So set ebx == ecx to workaroud it.
             */
            *ebx = xsave_area_size(env->xcr0);
        } else if (count == 1) {
            *eax = env->features[FEAT_XSAVE];
        } else if (count < ARRAY_SIZE(x86_ext_save_areas)) {
            if ((x86_cpu_xsave_components(cpu) >> count) & 1) {
                const ExtSaveArea *esa = &x86_ext_save_areas[count];
                *eax = esa->size;
                *ebx = esa->offset;
            }
        }
        break;
    }
    case 0x14: {
        /* Intel Processor Trace Enumeration */
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        if (!(env->features[FEAT_7_0_EBX] & CPUID_7_0_EBX_INTEL_PT)) {
            break;
        }

        if (count == 0) {
            *eax = INTEL_PT_MAX_SUBLEAF;
            *ebx = INTEL_PT_MINIMAL_EBX;
            *ecx = INTEL_PT_MINIMAL_ECX;
        } else if (count == 1) {
            *eax = INTEL_PT_MTC_BITMAP | INTEL_PT_ADDR_RANGES_NUM;
            *ebx = INTEL_PT_PSB_BITMAP | INTEL_PT_CYCLE_BITMAP;
        }
        break;
    }
    case 0x40000000:
        /*
         * CPUID code in kvm_arch_init_vcpu() ignores stuff
         * set here, but we restrict to TCG none the less.
         */
        if (cpu->expose_tcg) {
            memcpy(signature, "TCGTCGTCGTCG", 12);
            *eax = 0x40000001;
            *ebx = signature[0];
            *ecx = signature[1];
            *edx = signature[2];
        } else {
            *eax = 0;
            *ebx = 0;
            *ecx = 0;
            *edx = 0;
        }
        break;
    case 0x40000001:
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    case 0x80000000:
        *eax = env->cpuid_xlevel;
        *ebx = env->cpuid_vendor1;
        *edx = env->cpuid_vendor2;
        *ecx = env->cpuid_vendor3;
        break;
    case 0x80000001:
        *eax = env->cpuid_version;
        *ebx = 0;
        *ecx = env->features[FEAT_8000_0001_ECX];
        *edx = env->features[FEAT_8000_0001_EDX];

        /* The Linux kernel checks for the CMPLegacy bit and
         * discards multiple thread information if it is set.
         * So don't set it here for Intel to make Linux guests happy.
         */
        if (cs->nr_cores * cs->nr_threads > 1) {
            if (env->cpuid_vendor1 != CPUID_VENDOR_INTEL_1 ||
                env->cpuid_vendor2 != CPUID_VENDOR_INTEL_2 ||
                env->cpuid_vendor3 != CPUID_VENDOR_INTEL_3) {
                *ecx |= 1 << 1;    /* CmpLegacy bit */
            }
        }
        break;
    case 0x80000002:
    case 0x80000003:
    case 0x80000004:
        *eax = env->cpuid_model[(index - 0x80000002) * 4 + 0];
        *ebx = env->cpuid_model[(index - 0x80000002) * 4 + 1];
        *ecx = env->cpuid_model[(index - 0x80000002) * 4 + 2];
        *edx = env->cpuid_model[(index - 0x80000002) * 4 + 3];
        break;
    case 0x80000005:
        /* cache info (L1 cache) */
        if (cpu->cache_info_passthrough) {
            host_cpuid(index, 0, eax, ebx, ecx, edx);
            break;
        }
        *eax = (L1_DTLB_2M_ASSOC << 24) | (L1_DTLB_2M_ENTRIES << 16) | \
               (L1_ITLB_2M_ASSOC <<  8) | (L1_ITLB_2M_ENTRIES);
        *ebx = (L1_DTLB_4K_ASSOC << 24) | (L1_DTLB_4K_ENTRIES << 16) | \
               (L1_ITLB_4K_ASSOC <<  8) | (L1_ITLB_4K_ENTRIES);
        *ecx = encode_cache_cpuid80000005(env->cache_info_amd.l1d_cache);
        *edx = encode_cache_cpuid80000005(env->cache_info_amd.l1i_cache);
        break;
    case 0x80000006:
        /* cache info (L2 cache) */
        if (cpu->cache_info_passthrough) {
            host_cpuid(index, 0, eax, ebx, ecx, edx);
            break;
        }
        *eax = (AMD_ENC_ASSOC(L2_DTLB_2M_ASSOC) << 28) | \
               (L2_DTLB_2M_ENTRIES << 16) | \
               (AMD_ENC_ASSOC(L2_ITLB_2M_ASSOC) << 12) | \
               (L2_ITLB_2M_ENTRIES);
        *ebx = (AMD_ENC_ASSOC(L2_DTLB_4K_ASSOC) << 28) | \
               (L2_DTLB_4K_ENTRIES << 16) | \
               (AMD_ENC_ASSOC(L2_ITLB_4K_ASSOC) << 12) | \
               (L2_ITLB_4K_ENTRIES);
        encode_cache_cpuid80000006(env->cache_info_amd.l2_cache,
                                   cpu->enable_l3_cache ?
                                   env->cache_info_amd.l3_cache : NULL,
                                   ecx, edx);
        break;
    case 0x80000007:
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = env->features[FEAT_8000_0007_EDX];
        break;
    case 0x80000008:
        /* virtual & phys address size in low 2 bytes. */
        if (env->features[FEAT_8000_0001_EDX] & CPUID_EXT2_LM) {
            /* 64 bit processor */
            *eax = cpu->phys_bits; /* configurable physical bits */
            if  (env->features[FEAT_7_0_ECX] & CPUID_7_0_ECX_LA57) {
                *eax |= 0x00003900; /* 57 bits virtual */
            } else {
                *eax |= 0x00003000; /* 48 bits virtual */
            }
        } else {
            *eax = cpu->phys_bits;
        }
        *ebx = env->features[FEAT_8000_0008_EBX];
        *ecx = 0;
        *edx = 0;
        if (cs->nr_cores * cs->nr_threads > 1) {
            *ecx |= (cs->nr_cores * cs->nr_threads) - 1;
        }
        break;
    case 0x8000000A:
        if (env->features[FEAT_8000_0001_ECX] & CPUID_EXT3_SVM) {
            *eax = 0x00000001; /* SVM Revision */
            *ebx = 0x00000010; /* nr of ASIDs */
            *ecx = 0;
            *edx = env->features[FEAT_SVM]; /* optional features */
        } else {
            *eax = 0;
            *ebx = 0;
            *ecx = 0;
            *edx = 0;
        }
        break;
    case 0x8000001D:
        *eax = 0;
        if (cpu->cache_info_passthrough) {
            host_cpuid(index, count, eax, ebx, ecx, edx);
            break;
        }
        switch (count) {
        case 0: /* L1 dcache info */
            encode_cache_cpuid8000001d(env->cache_info_amd.l1d_cache,
                                       &topo_info, eax, ebx, ecx, edx);
            break;
        case 1: /* L1 icache info */
            encode_cache_cpuid8000001d(env->cache_info_amd.l1i_cache,
                                       &topo_info, eax, ebx, ecx, edx);
            break;
        case 2: /* L2 cache info */
            encode_cache_cpuid8000001d(env->cache_info_amd.l2_cache,
                                       &topo_info, eax, ebx, ecx, edx);
            break;
        case 3: /* L3 cache info */
            encode_cache_cpuid8000001d(env->cache_info_amd.l3_cache,
                                       &topo_info, eax, ebx, ecx, edx);
            break;
        default: /* end of info */
            *eax = *ebx = *ecx = *edx = 0;
            break;
        }
        break;
    case 0x8000001E:
        assert(cpu->core_id <= 255);
        encode_topo_cpuid8000001e(&topo_info, cpu, eax, ebx, ecx, edx);
        break;
    case 0xC0000000:
        *eax = env->cpuid_xlevel2;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    case 0xC0000001:
        /* Support for VIA CPU's CPUID instruction */
        *eax = env->cpuid_version;
        *ebx = 0;
        *ecx = 0;
        *edx = env->features[FEAT_C000_0001_EDX];
        break;
    case 0xC0000002:
    case 0xC0000003:
    case 0xC0000004:
        /* Reserved for the future, and now filled with zero */
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    default:
        /* reserved values: zero */
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    }
}